

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

void (anonymous_namespace)::test<ddd::DictionarySGL<true,true>>
               (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs,
               unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
               *dic)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  pointer pDVar7;
  size_type sVar8;
  size_type sVar9;
  reference ppKVar10;
  undefined8 uVar11;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_RDI;
  Stat stat_3;
  KvPair *kv_8;
  iterator __end2_8;
  iterator __begin2_8;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_8;
  KvPair *kv_7;
  iterator __end2_7;
  iterator __begin2_7;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_7;
  ifstream ifs_2;
  Stat stat_2;
  KvPair *kv_6;
  iterator __end2_6;
  iterator __begin2_6;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_6;
  KvPair *kv_5;
  iterator __end2_5;
  iterator __begin2_5;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_5;
  ifstream ifs_1;
  Stat stat_1;
  size_t size;
  ifstream ifs;
  ofstream ofs;
  char *file_name;
  KvPair *kv_4;
  iterator __end2_4;
  iterator __begin2_4;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_4;
  KvPair *kv_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_3;
  KvPair *kv_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_2;
  size_t i;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> test_kvs [2];
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> ret;
  Stat stat;
  KvPair *kv_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *__range2_1;
  KvPair *kv;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *__range2;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *in_stack_fffffffffffff388;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *in_stack_fffffffffffff390;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *in_stack_fffffffffffff3a0;
  basic_ifstream<char,_std::char_traits<char>_> *in_stack_fffffffffffff3a8;
  undefined1 *local_c48;
  undefined1 *local_b60;
  Stat local_b28;
  KvPair *local_ad8;
  KvPair **local_ad0;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_ac8;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *local_ac0;
  KvPair *local_ab8;
  KvPair **local_ab0;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_aa8;
  undefined1 *local_aa0;
  undefined1 local_a90 [520];
  Stat local_888;
  KvPair *local_838;
  KvPair **local_830;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_828;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *local_820;
  KvPair *local_818;
  KvPair **local_810;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_808;
  undefined1 *local_800;
  undefined1 local_7f0 [520];
  Stat local_5e8;
  fpos local_590 [16];
  size_t local_580;
  undefined1 local_578 [520];
  undefined1 local_370 [512];
  char *local_170;
  KvPair *local_168;
  KvPair **local_160;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_158;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *local_150;
  KvPair *local_148;
  KvPair **local_140;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_138;
  undefined1 *local_130;
  KvPair *local_128;
  KvPair **local_120;
  __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
  local_118;
  undefined1 *local_110;
  const_reference local_108;
  ulong local_100;
  undefined1 local_f8 [24];
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> vStack_e0;
  undefined1 auStack_c8 [16];
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> local_b8;
  Stat local_a0;
  reference local_50;
  KvPair *local_48;
  __normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
  local_40;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *local_38;
  reference local_30;
  KvPair *local_28;
  __normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
  local_20 [3];
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *local_8;
  
  local_8 = in_RDI;
  local_20[0]._M_current =
       (KvPair *)
       std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::begin
                 ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_stack_fffffffffffff388);
  local_28 = (KvPair *)
             std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::end
                       ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                        in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
               ::operator*(local_20);
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14e189);
    uVar11 = std::__cxx11::string::c_str();
    uVar4 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[4])(pDVar7,uVar11,(ulong)local_30->value);
    if ((uVar4 & 1) == 0) {
      __assert_fail("dic->insert_key(kv.key.c_str(), kv.value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x3a,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
    ::operator++(local_20);
  }
  local_38 = local_8;
  local_40._M_current =
       (KvPair *)
       std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::begin
                 ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_stack_fffffffffffff388);
  local_48 = (KvPair *)
             std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::end
                       ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                        in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
               ::operator*(&local_40);
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14e26f);
    uVar11 = std::__cxx11::string::c_str();
    uVar6 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (uVar6 != local_50->value) {
      __assert_fail("dic->search_key(kv.key.c_str()) == kv.value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x3d,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
    ::operator++(&local_40);
  }
  memset(&local_a0,0,0x50);
  ddd::Stat::Stat(&local_a0);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14e305);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[10])(pDVar7,&local_a0);
  sVar8 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(local_8);
  if (local_a0.num_keys != sVar8) {
    __assert_fail("stat.num_keys == kvs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                  ,0x42,
                  "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                 );
  }
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::vector
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x14e379);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14e386);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[6])(pDVar7,&local_b8);
  sVar8 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(local_8);
  sVar9 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(&local_b8);
  if (sVar8 != sVar9) {
    __assert_fail("kvs.size() == ret.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                  ,0x47,
                  "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                 );
  }
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_stack_fffffffffffff3a0);
  local_b60 = local_f8;
  do {
    std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::vector
              ((vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *)0x14e456);
    local_b60 = local_b60 + 0x18;
  } while (local_b60 != auStack_c8);
  local_100 = 0;
  while( true ) {
    uVar2 = local_100;
    sVar8 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(local_8);
    if (sVar8 <= uVar2) break;
    local_108 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::operator[]
                          (local_8,local_100);
    std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::push_back
              (in_stack_fffffffffffff390,(value_type *)in_stack_fffffffffffff388);
    local_100 = local_100 + 1;
  }
  local_110 = local_f8;
  local_118._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_120 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_118);
    local_128 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14e5b2);
    uVar11 = std::__cxx11::string::c_str();
    uVar6 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[5])(pDVar7,uVar11);
    if (uVar6 != local_128->value) {
      __assert_fail("dic->delete_key(kv->key.c_str()) == kv->value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x50,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_118);
  }
  local_130 = local_f8;
  local_138._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_140 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_138);
    local_148 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14e6aa);
    uVar11 = std::__cxx11::string::c_str();
    iVar5 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (iVar5 != -1) {
      __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x53,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_138);
  }
  local_150 = &vStack_e0;
  local_158._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_160 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_158);
    local_168 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14e79e);
    uVar11 = std::__cxx11::string::c_str();
    uVar6 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (uVar6 != local_168->value) {
      __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x56,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_158);
  }
  local_170 = "test.index";
  std::ofstream::ofstream(local_370,"test.index",0x10);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14e851);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[0xc])(pDVar7,local_370);
  std::ofstream::~ofstream(local_370);
  std::ifstream::ifstream(local_578,local_170,8);
  std::istream::seekg((long)local_578,_S_beg);
  local_590 = (fpos  [16])std::istream::tellg();
  local_580 = std::fpos::operator_cast_to_long(local_590);
  local_5e8.tail_emps = 0;
  local_5e8.size_in_bytes = 0;
  local_5e8.tail_size = 0;
  local_5e8.tail_capa = 0;
  local_5e8.bc_capa = 0;
  local_5e8.bc_emps = 0;
  local_5e8.num_nodes = 0;
  local_5e8.bc_size = 0;
  local_5e8.num_keys = 0;
  local_5e8.num_tries = 0;
  ddd::Stat::Stat(&local_5e8);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14e951);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[10])(pDVar7,&local_5e8);
  if (local_5e8.size_in_bytes != local_580) {
    __assert_fail("stat.size_in_bytes == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                  ,100,
                  "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                 );
  }
  std::ifstream::~ifstream(local_578);
  std::ifstream::ifstream(local_7f0,local_170,8);
  ddd::make_unique<ddd::DictionarySGL<true,true>,std::ifstream&>(in_stack_fffffffffffff3a8);
  std::
  unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
  ::operator=((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
               *)in_stack_fffffffffffff390,
              (unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
               *)in_stack_fffffffffffff388);
  std::
  unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
  ::~unique_ptr((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                 *)in_stack_fffffffffffff390);
  std::ifstream::~ifstream(local_7f0);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14ea6a);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[7])();
  local_800 = local_f8;
  local_808._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_810 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_808);
    local_818 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14eaf5);
    uVar11 = std::__cxx11::string::c_str();
    iVar5 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (iVar5 != -1) {
      __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x6f,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_808);
  }
  local_820 = &vStack_e0;
  local_828._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_830 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_828);
    local_838 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14ec0f);
    uVar11 = std::__cxx11::string::c_str();
    uVar6 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (uVar6 != local_838->value) {
      __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x72,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_828);
  }
  local_888.tail_emps = 0;
  local_888.size_in_bytes = 0;
  local_888.tail_size = 0;
  local_888.tail_capa = 0;
  local_888.bc_capa = 0;
  local_888.bc_emps = 0;
  local_888.num_nodes = 0;
  local_888.bc_size = 0;
  local_888.num_keys = 0;
  local_888.num_tries = 0;
  ddd::Stat::Stat(&local_888);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14ecd4);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[10])(pDVar7,&local_888);
  sVar1 = local_888.num_keys;
  sVar8 = std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::size(&vStack_e0);
  if (sVar1 != sVar8) {
    __assert_fail("stat.num_keys == test_kvs[1].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                  ,0x77,
                  "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                 );
  }
  std::ifstream::ifstream(local_a90,local_170,8);
  ddd::make_unique<ddd::DictionarySGL<true,true>,std::ifstream&>(in_stack_fffffffffffff3a8);
  std::
  unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
  ::operator=((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
               *)in_stack_fffffffffffff390,
              (unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
               *)in_stack_fffffffffffff388);
  std::
  unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
  ::~unique_ptr((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                 *)in_stack_fffffffffffff390);
  std::ifstream::~ifstream(local_a90);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14eda4);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[8])();
  local_aa0 = local_f8;
  local_aa8._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_ab0 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_aa8);
    local_ab8 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14ee2f);
    uVar11 = std::__cxx11::string::c_str();
    iVar5 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (iVar5 != -1) {
      __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x82,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_aa8);
  }
  local_ac0 = &vStack_e0;
  local_ac8._M_current =
       (KvPair **)
       std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::begin
                 (in_stack_fffffffffffff388);
  local_ad0 = (KvPair **)
              std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::end
                        (in_stack_fffffffffffff388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff390,
                       (__normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
                        *)in_stack_fffffffffffff388);
    if (!bVar3) break;
    ppKVar10 = __gnu_cxx::
               __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
               ::operator*(&local_ac8);
    local_ad8 = *ppKVar10;
    pDVar7 = std::
             unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
             ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)0x14ef3d);
    uVar11 = std::__cxx11::string::c_str();
    uVar6 = (*(pDVar7->super_Dictionary)._vptr_Dictionary[3])(pDVar7,uVar11);
    if (uVar6 != local_ad8->value) {
      __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x85,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_ddd::KvPair_**,_std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>_>
    ::operator++(&local_ac8);
  }
  local_b28.tail_emps = 0;
  local_b28.size_in_bytes = 0;
  local_b28.tail_size = 0;
  local_b28.tail_capa = 0;
  local_b28.bc_capa = 0;
  local_b28.bc_emps = 0;
  local_b28.num_nodes = 0;
  local_b28.bc_size = 0;
  local_b28.num_keys = 0;
  local_b28.num_tries = 0;
  ddd::Stat::Stat(&local_b28);
  pDVar7 = std::
           unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
           ::operator->((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)0x14eff6);
  (*(pDVar7->super_Dictionary)._vptr_Dictionary[10])(pDVar7,&local_b28);
  sVar1 = local_b28.num_keys;
  sVar8 = std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::size(&vStack_e0);
  if (sVar1 == sVar8) {
    local_c48 = auStack_c8;
    do {
      local_c48 = local_c48 + -0x18;
      std::vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::~vector
                (in_stack_fffffffffffff3a0);
    } while (local_c48 != local_f8);
    return;
  }
  __assert_fail("stat.num_keys == test_kvs[1].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp",
                0x8a,
                "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionarySGL<true, true>]"
               );
}

Assistant:

void test(const std::vector<KvPair>& kvs, std::unique_ptr<T> dic) {
  for (auto &kv : kvs) {
    assert(dic->insert_key(kv.key.c_str(), kv.value));
  }
  for (auto &kv : kvs) {
    assert(dic->search_key(kv.key.c_str()) == kv.value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == kvs.size());
  }
  {
    std::vector<KvPair> ret;
    dic->enumerate(ret);
    assert(kvs.size() == ret.size());
  }

  std::vector<const KvPair*> test_kvs[2];
  for (size_t i = 0; i < kvs.size(); ++i) {
    test_kvs[i % 2].push_back(&kvs[i]);
  }

  for (auto kv : test_kvs[0]) {
    assert(dic->delete_key(kv->key.c_str()) == kv->value);
  }
  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }

  const char* file_name = "test.index";
  {
    std::ofstream ofs{file_name};
    dic->write(ofs);
  }

  {
    std::ifstream ifs{file_name};
    auto size = static_cast<size_t>(ifs.seekg(0, std::ios::end).tellg());
    Stat stat{};
    dic->stat(stat);
    assert(stat.size_in_bytes == size);
  }

  {
    std::ifstream ifs{file_name};
    dic = make_unique<T>(ifs);
  }

  dic->pack();

  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == test_kvs[1].size());
  }

  {
    std::ifstream ifs{file_name};
    dic = make_unique<T>(ifs);
  }

  dic->rebuild();

  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == test_kvs[1].size());
  }
}